

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVM.cpp
# Opt level: O2

uint __thiscall NanoVM::pop<unsigned_int>(NanoVM *this)

{
  ulong uVar1;
  uint uVar2;
  uint64_t uVar3;
  
  uVar3 = (this->cpu).registers[7];
  uVar1 = uVar3 - 4;
  if (uVar1 < (this->cpu).codeSize) {
    this->errorFlag = 0x80;
    return 0;
  }
  uVar2 = *(uint *)((this->cpu).codeBase + (uVar3 - 4));
  (this->cpu).registers[7] = uVar1;
  return uVar2;
}

Assistant:

inline T NanoVM::pop() {
	// Check bounds
	if (cpu.registers[esp] - sizeof(T) < cpu.codeSize) {
		// Reached the bottom of stack
		errorFlag = STACK_ERROR;
		return 0;
	}
	// pop value from stack
	T value = *reinterpret_cast<T*>(cpu.codeBase + cpu.registers[esp] - sizeof(T));
	// update esp
	cpu.registers[esp] -= sizeof(value);
	return value;
}